

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP3Writer::EndStep(BP3Writer *this)

{
  int iVar1;
  _func_int *p_Var2;
  ScopedTimer __var294;
  
  if (EndStep()::__var94 == '\0') {
    iVar1 = __cxa_guard_acquire(&EndStep()::__var94);
    if (iVar1 != 0) {
      EndStep::__var94 = (void *)ps_timer_create_("BP3Writer::EndStep");
      __cxa_guard_release(&EndStep()::__var94);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&__var294,EndStep::__var94);
  if (*(long *)((this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3] + 0x390 +
               (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) != 0) {
    PerformPuts(this);
  }
  adios2::format::BPSerializer::SerializeData
            ((BPSerializer *)&(this->m_BP3Serializer).super_BP3Base.field_0x8,
             (this->super_Engine).m_IO,true);
  p_Var2 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3];
  if (*(ulong *)(p_Var2 + 0x1d8 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) %
      *(ulong *)(p_Var2 + 0x200 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) == 0)
  {
    Flush(this,-1);
    p_Var2 = (this->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3];
  }
  if (*(int *)(p_Var2 + 0x10 + (long)&(this->m_BP3Serializer).super_BP3Base._vptr_BP3Base) == 0) {
    ADIOS::RecordOutputStep
              (((this->super_Engine).m_IO)->m_ADIOS,&(this->super_Engine).m_Name,0xffffffffffffffff,
               INFINITY);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var294);
  return;
}

Assistant:

void BP3Writer::EndStep()
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::EndStep");
    if (m_BP3Serializer.m_DeferredVariables.size() > 0)
    {
        PerformPuts();
    }

    // true: advances step
    m_BP3Serializer.SerializeData(m_IO, true);

    const size_t currentStep = CurrentStep();
    const size_t flushStepsCount = m_BP3Serializer.m_Parameters.FlushStepsCount;

    if (currentStep % flushStepsCount == 0)
    {
        Flush();
    }

    if (m_BP3Serializer.m_RankMPI == 0)
    {
        m_IO.m_ADIOS.RecordOutputStep(m_Name, UnknownStep, UnknownTime);
    }
}